

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison.h
# Opt level: O2

bool Compare<Date_const&>(Date *lhs,Date *rhs,Comparison cmp)

{
  bool bVar1;
  
  switch(cmp) {
  case Less:
    bVar1 = Date::operator<(lhs,rhs);
    return bVar1;
  case LessOrEqual:
    bVar1 = Date::operator<=(lhs,rhs);
    return bVar1;
  case Greater:
    bVar1 = Date::operator>(lhs,rhs);
    return bVar1;
  case GreaterOrEqual:
    bVar1 = Date::operator>=(lhs,rhs);
    return bVar1;
  case Equal:
    bVar1 = Date::operator==(lhs,rhs);
    return bVar1;
  case NotEqual:
    bVar1 = Date::operator!=(lhs,rhs);
    return bVar1;
  default:
    return true;
  }
}

Assistant:

bool Compare(ValueType lhs, ValueType rhs, Comparison cmp) {
    switch (cmp) {
    case Comparison::Less:
        return lhs < rhs;
    case Comparison::LessOrEqual:
        return lhs <= rhs;
    case Comparison::Greater:
        return lhs > rhs;
    case Comparison::GreaterOrEqual:
        return lhs >= rhs;
    case Comparison::Equal:
        return lhs == rhs;
    case Comparison::NotEqual:
        return lhs != rhs;
    default:
        return true;
    }
}